

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

int UpnpAddVirtualDir(char *newDirName,void *cookie,void **oldcookie)

{
  virtual_Dir_List *pvVar1;
  int iVar2;
  size_t sVar3;
  virtualDirList *pvVar4;
  virtualDirList *pvVar5;
  char *__dest;
  virtualDirList **ppvVar6;
  char dirName [256];
  
  __dest = dirName;
  memset(dirName,0,0x100);
  if (UpnpSdkInit == 1) {
    iVar2 = -0x65;
    if ((newDirName != (char *)0x0) && (sVar3 = strlen(newDirName), sVar3 != 0)) {
      if (*newDirName == '/') {
        if (0xff < sVar3) {
          return -0x65;
        }
        sVar3 = 0xff;
      }
      else {
        if (0xfe < sVar3) {
          return -0x65;
        }
        __dest = dirName + 1;
        dirName[0] = '/';
        sVar3 = 0xfe;
      }
      strncpy(__dest,newDirName,sVar3);
      ppvVar6 = &pVirtualDirList;
      do {
        ppvVar6 = &((virtualDirList *)ppvVar6)->next->next;
        if ((virtualDirList *)ppvVar6 == (virtualDirList *)0x0) {
          pvVar4 = (virtualDirList *)malloc(0x110);
          if (pvVar4 == (virtual_Dir_List *)0x0) {
            return -0x68;
          }
          pvVar4->next = (virtual_Dir_List *)0x0;
          if (oldcookie != (void **)0x0) {
            *oldcookie = (void *)0x0;
          }
          pvVar4->cookie = cookie;
          pvVar4->dirName[0xf8] = '\0';
          pvVar4->dirName[0xf9] = '\0';
          pvVar4->dirName[0xfa] = '\0';
          pvVar4->dirName[0xfb] = '\0';
          pvVar4->dirName[0xfc] = '\0';
          pvVar4->dirName[0xfd] = '\0';
          pvVar4->dirName[0xfe] = '\0';
          pvVar4->dirName[0xff] = '\0';
          strncpy(pvVar4->dirName,dirName,0xff);
          sVar3 = strlen(dirName);
          pvVar4->dirName[sVar3] = '\0';
          pvVar1 = pVirtualDirList;
          if (pVirtualDirList != (virtualDirList *)0x0) {
            do {
              pvVar5 = pvVar1;
              pvVar1 = pvVar5->next;
            } while (pvVar1 != (virtual_Dir_List *)0x0);
            pvVar5->next = pvVar4;
            pvVar4 = pVirtualDirList;
          }
          goto LAB_0011190a;
        }
        iVar2 = strcmp(((virtualDirList *)ppvVar6)->dirName,dirName);
      } while (iVar2 != 0);
      if (oldcookie != (void **)0x0) {
        *oldcookie = ((virtualDirList *)ppvVar6)->cookie;
      }
      ((virtualDirList *)ppvVar6)->cookie = cookie;
      pvVar4 = pVirtualDirList;
LAB_0011190a:
      pVirtualDirList = pvVar4;
      iVar2 = 0;
    }
  }
  else {
    iVar2 = -0x74;
  }
  return iVar2;
}

Assistant:

int UpnpAddVirtualDir(
	const char *newDirName, const void *cookie, const void **oldcookie)
{
	virtualDirList *pNewVirtualDir;
	virtualDirList *pLast;
	virtualDirList *pCurVirtualDir;
	char dirName[NAME_SIZE];

	memset(dirName, 0, sizeof(dirName));
	if (UpnpSdkInit != 1) {
		/* SDK is not initialized */
		return UPNP_E_FINISH;
	}

	if ((newDirName == NULL) || (strlen(newDirName) == (size_t)0)) {
		return UPNP_E_INVALID_PARAM;
	}

	if (*newDirName != '/') {
		if (strlen(newDirName) > sizeof(dirName) - 2)
			return UPNP_E_INVALID_PARAM;
		dirName[0] = '/';
		strncpy(dirName + 1, newDirName, sizeof(dirName) - 2);
	} else {
		if (strlen(newDirName) > sizeof(dirName) - 1)
			return UPNP_E_INVALID_PARAM;
		strncpy(dirName, newDirName, sizeof(dirName) - 1);
	}

	pCurVirtualDir = pVirtualDirList;
	while (pCurVirtualDir != NULL) {
		/* already has this entry */
		if (strcmp(pCurVirtualDir->dirName, dirName) == 0) {
			if (oldcookie != NULL)
				*oldcookie = pCurVirtualDir->cookie;
			pCurVirtualDir->cookie = cookie;
			return UPNP_E_SUCCESS;
		}

		pCurVirtualDir = pCurVirtualDir->next;
	}

	pNewVirtualDir = (virtualDirList *)malloc(sizeof(virtualDirList));
	if (pNewVirtualDir == NULL) {
		return UPNP_E_OUTOF_MEMORY;
	}
	pNewVirtualDir->next = NULL;
	if (oldcookie != NULL)
		*oldcookie = NULL;
	pNewVirtualDir->cookie = cookie;
	memset(pNewVirtualDir->dirName, 0, sizeof(pNewVirtualDir->dirName));
	strncpy(pNewVirtualDir->dirName,
		dirName,
		sizeof(pNewVirtualDir->dirName) - 1);
	*(pNewVirtualDir->dirName + strlen(dirName)) = 0;

	if (pVirtualDirList == NULL) { /* first virtual dir */
		pVirtualDirList = pNewVirtualDir;
	} else {
		pLast = pVirtualDirList;
		while (pLast->next != NULL) {
			pLast = pLast->next;
		}
		pLast->next = pNewVirtualDir;
	}

	return UPNP_E_SUCCESS;
}